

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall Inline::InsertStatementBoundary(Inline *this,Instr *instrNext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PragmaInstr *pPVar4;
  Func *func;
  
  pPVar4 = this->lastStatementBoundary;
  if (pPVar4 == (PragmaInstr *)0x0) {
    return;
  }
  func = (pPVar4->super_Instr).m_func;
  if (func != instrNext->m_func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1060,"(lastStatementBoundary->m_func == instrNext->m_func)",
                       "lastStatementBoundary->m_func == instrNext->m_func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pPVar4 = this->lastStatementBoundary;
    func = (pPVar4->super_Instr).m_func;
  }
  pPVar4 = IR::PragmaInstr::New(StatementBoundary,pPVar4->m_statementIndex,func);
  IR::Instr::SetByteCodeOffset(&pPVar4->super_Instr,instrNext);
  IR::Instr::InsertBefore(instrNext,&pPVar4->super_Instr);
  return;
}

Assistant:

void
Inline::InsertStatementBoundary(IR::Instr * instrNext)
{
    if (lastStatementBoundary)
    {
        Assert(lastStatementBoundary->m_func == instrNext->m_func);
        IR::PragmaInstr * pragmaInstr = IR::PragmaInstr::New(Js::OpCode::StatementBoundary,
            lastStatementBoundary->m_statementIndex,
            lastStatementBoundary->m_func);
        pragmaInstr->SetByteCodeOffset(instrNext);
        instrNext->InsertBefore(pragmaInstr);
    }
}